

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O1

Cut_Oracle_t * Cut_OracleStart(Cut_Man_t *pMan)

{
  uint uVar1;
  int iVar2;
  Cut_Params_t *pCVar3;
  Cut_Oracle_t *pCVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  Extra_MmFixed_t *pEVar8;
  int iVar9;
  uint uVar10;
  
  pCVar3 = pMan->pParams;
  if (9 < pCVar3->nVarsMax - 3U) {
    __assert_fail("pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                  ,0x4d,"Cut_Oracle_t *Cut_OracleStart(Cut_Man_t *)");
  }
  if (pCVar3->fRecord != 0) {
    pCVar4 = (Cut_Oracle_t *)malloc(0x68);
    pCVar4->pParams = (Cut_Params_t *)0x0;
    pCVar4->vFanCounts = (Vec_Int_t *)0x0;
    *(undefined8 *)&pCVar4->fSimul = 0;
    pCVar4->vCutsNew = (Vec_Ptr_t *)0x0;
    pCVar4->vCuts0 = (Vec_Ptr_t *)0x0;
    pCVar4->vCuts1 = (Vec_Ptr_t *)0x0;
    pCVar4->vNodeCuts = (Vec_Int_t *)0x0;
    pCVar4->vNodeStarts = (Vec_Int_t *)0x0;
    pCVar4->vCutPairs = (Vec_Int_t *)0x0;
    pCVar4->pMmCuts = (Extra_MmFixed_t *)0x0;
    pCVar4->EntrySize = 0;
    pCVar4->nTruthWords = 0;
    pCVar4->timeTotal = 0;
    ppvVar6 = (void **)0x0;
    pCVar4->nCuts = 0;
    pCVar4->nCutsTriv = 0;
    pCVar4->pParams = pCVar3;
    pCVar4->vNodeCuts = pMan->vNodeCuts;
    pMan->vNodeCuts = (Vec_Int_t *)0x0;
    pCVar4->vNodeStarts = pMan->vNodeStarts;
    pMan->vNodeStarts = (Vec_Int_t *)0x0;
    pCVar4->vCutPairs = pMan->vCutPairs;
    pMan->vCutPairs = (Vec_Int_t *)0x0;
    uVar1 = pCVar3->nIdsMax;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    uVar10 = 8;
    if (6 < uVar1 - 1) {
      uVar10 = uVar1;
    }
    pVVar5->nSize = 0;
    pVVar5->nCap = uVar10;
    if (uVar10 != 0) {
      ppvVar6 = (void **)malloc((long)(int)uVar10 << 3);
    }
    pVVar5->pArray = ppvVar6;
    pCVar4->vCutsNew = pVVar5;
    if ((int)uVar10 < (int)uVar1) {
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc((long)(int)uVar1 << 3);
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,(long)(int)uVar1 << 3);
      }
      pVVar5->pArray = ppvVar6;
      pVVar5->nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        pVVar5->pArray[uVar7] = (void *)0x0;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    pVVar5->nSize = uVar1;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    pVVar5->pArray = ppvVar6;
    pCVar4->vCuts0 = pVVar5;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    pVVar5->pArray = ppvVar6;
    pCVar4->vCuts1 = pVVar5;
    iVar2 = pCVar3->nVarsMax;
    pCVar4->EntrySize = iVar2 * 4 + 0x18;
    if (pCVar3->fTruth != 0) {
      if (iVar2 < 9) {
        iVar9 = 1 << ((char)iVar2 - 5U & 0x1f);
        if (iVar2 < 6) {
          iVar9 = 1;
        }
        pCVar4->nTruthWords = iVar9;
        pCVar4->EntrySize = (iVar9 + iVar2) * 4 + 0x18;
      }
      else {
        pCVar3->fTruth = 0;
        puts("Skipping computation of truth table for more than 8 inputs.");
      }
    }
    pEVar8 = Extra_MmFixedStart(pCVar4->EntrySize);
    pCVar4->pMmCuts = pEVar8;
    return pCVar4;
  }
  __assert_fail("pMan->pParams->fRecord",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                ,0x4e,"Cut_Oracle_t *Cut_OracleStart(Cut_Man_t *)");
}

Assistant:

Cut_Oracle_t * Cut_OracleStart( Cut_Man_t * pMan )
{
    Cut_Oracle_t * p;

    assert( pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX );
    assert( pMan->pParams->fRecord );

    p = ABC_ALLOC( Cut_Oracle_t, 1 );
    memset( p, 0, sizeof(Cut_Oracle_t) );

    // set and correct parameters
    p->pParams     = pMan->pParams;

    // transfer the recording info
    p->vNodeCuts   = pMan->vNodeCuts;    pMan->vNodeCuts   = NULL;
    p->vNodeStarts = pMan->vNodeStarts;  pMan->vNodeStarts = NULL;
    p->vCutPairs   = pMan->vCutPairs;    pMan->vCutPairs   = NULL;

    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( p->pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, p->pParams->nIdsMax, NULL );
    p->vCuts0 = Vec_PtrAlloc( 100 );
    p->vCuts1 = Vec_PtrAlloc( 100 );

    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + p->pParams->nVarsMax * sizeof(int);
    if ( p->pParams->fTruth )
    {
        if ( p->pParams->nVarsMax > 8 )
        {
            p->pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than 8 inputs.\n" );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( p->pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    return p;
}